

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HSimplexNlaProductForm.cpp
# Opt level: O0

void __thiscall
ProductFormUpdate::setup(ProductFormUpdate *this,HighsInt num_row,double expected_density)

{
  value_type_conflict2 in_ESI;
  value_type_conflict2 *in_RDI;
  HighsInt reserve_entry_space;
  uint in_stack_ffffffffffffffe0;
  
  *(undefined1 *)in_RDI = 1;
  in_RDI[1] = in_ESI;
  in_RDI[2] = 0;
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)(ulong)in_stack_ffffffffffffffe0,in_RDI);
  std::vector<int,_std::allocator<int>_>::reserve
            ((vector<int,_std::allocator<int>_> *)expected_density,_reserve_entry_space);
  std::vector<double,_std::allocator<double>_>::reserve
            ((vector<double,_std::allocator<double>_> *)expected_density,_reserve_entry_space);
  return;
}

Assistant:

void ProductFormUpdate::setup(const HighsInt num_row,
                              const double expected_density) {
  valid_ = true;
  num_row_ = num_row;
  update_count_ = 0;
  start_.push_back(0);
  HighsInt reserve_entry_space =
      kProductFormExtraEntries +
      kProductFormMaxUpdates * num_row * expected_density;
  index_.reserve(reserve_entry_space);
  value_.reserve(reserve_entry_space);
}